

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * vector_representation_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                   *vector)

{
  pointer psVar1;
  string elements_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  for (psVar1 = (vector->
                super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar1 != (vector->
                super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
    if (psVar1 != (vector->
                  super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::append((char *)&local_50);
    }
    (*((psVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Instance[2]
    )(&local_70);
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator+(&local_70,"[",&local_50);
  std::operator+(__return_storage_ptr__,&local_70,"]");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string vector_representation(const std::vector<std::shared_ptr<Instance>>& vector) {
    std::string elements_str;
    for (auto it = vector.begin(); it != vector.end(); it++) {
        if (it != vector.begin())
            elements_str += ",";
        elements_str += (*it)->representation();
    }
    return "[" + elements_str + "]";
}